

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

char * skip_ws(char *p,char *end)

{
  int c;
  char *end_local;
  char *p_local;
  
  for (end_local = p; (end_local < end && ((*end_local == ' ' || (*end_local == '\t'))));
      end_local = end_local + 1) {
  }
  return end_local;
}

Assistant:

static inline const char* skip_ws(const char* p, const char* end)
{
	while (p < end) {
		int c = *p;
		if (c != ' ' && c != '\t')
			break;
		++p;
	}
	return p;
}